

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTSoundBank_Prepare
                   (FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,int32_t timeOffset
                   ,FACTCue **ppCue)

{
  ushort uVar1;
  FACTCueData *pFVar2;
  FACTVariationTable *pFVar3;
  FACTAudioEngine *pFVar4;
  FACTVariable *pFVar5;
  FACTCue *pFVar6;
  uint32_t uVar7;
  FACTCue *pFVar8;
  float *pfVar9;
  FACTCue *pFVar10;
  long lVar11;
  long lVar12;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *ppCue = (FACTCue *)0x0;
    uVar7 = 1;
  }
  else {
    pFVar8 = (FACTCue *)(*pSoundBank->parentEngine->pMalloc)(0xb0);
    *ppCue = pFVar8;
    SDL_memset(pFVar8,0,0xb0);
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    (*ppCue)->parentBank = pSoundBank;
    (*ppCue)->next = (FACTCue *)0x0;
    pFVar8 = *ppCue;
    pFVar8->managed = '\0';
    pFVar8->index = nCueIndex;
    pFVar8->notifyOnDestroy = '\0';
    pFVar8->usercontext = (void *)0x0;
    (*ppCue)->data = (FACTCueData *)(&pSoundBank->cues->flags + (uint)nCueIndex * 0x14);
    pFVar8 = *ppCue;
    pFVar2 = pFVar8->data;
    if ((pFVar2->flags & 4) == 0) {
      if (pSoundBank->variationCount != 0) {
        lVar12 = 0;
        lVar11 = 0;
        do {
          if (pFVar2->sbCode == pSoundBank->variationCodes[lVar12]) {
            (pFVar8->field_7).variation =
                 (FACTVariationTable *)((long)pSoundBank->variations - lVar11);
            break;
          }
          lVar11 = lVar11 + -0x10;
          lVar12 = lVar12 + 1;
        } while (pSoundBank->variationCount != (uint16_t)lVar12);
      }
      pFVar3 = ((*ppCue)->field_7).variation;
      if (pFVar3->flags == '\x03') {
        (*ppCue)->interactive = pSoundBank->parentEngine->variables[pFVar3->variable].initialValue;
      }
    }
    else if (pSoundBank->soundCount != 0) {
      lVar12 = 0;
      lVar11 = 0;
      do {
        if (pFVar2->sbCode == pSoundBank->soundCodes[lVar12]) {
          (pFVar8->field_7).variation = (FACTVariationTable *)((long)pSoundBank->sounds - lVar11);
          break;
        }
        lVar11 = lVar11 + -0x28;
        lVar12 = lVar12 + 1;
      } while (pSoundBank->soundCount != (uint16_t)lVar12);
    }
    pfVar9 = (float *)(*pSoundBank->parentEngine->pMalloc)
                                ((ulong)pSoundBank->parentEngine->variableCount << 2);
    (*ppCue)->variableValues = pfVar9;
    pFVar4 = pSoundBank->parentEngine;
    uVar1 = pFVar4->variableCount;
    if (uVar1 != 0) {
      pFVar5 = pFVar4->variables;
      pfVar9 = (*ppCue)->variableValues;
      lVar11 = 0;
      do {
        *(float *)((long)pfVar9 + lVar11) = (&pFVar5->initialValue)[lVar11];
        lVar11 = lVar11 + 4;
      } while ((ulong)uVar1 * 4 != lVar11);
    }
    pFVar8 = *ppCue;
    pFVar8->state = 4;
    pFVar6 = pSoundBank->cueList;
    while (pFVar10 = pFVar6, pFVar10 != (FACTCue *)0x0) {
      pSoundBank = (FACTSoundBank *)pFVar10;
      pFVar6 = pFVar10->next;
    }
    pSoundBank->cueList = pFVar8;
    FAudio_PlatformUnlockMutex(pFVar4->apiLock);
    uVar7 = 0;
  }
  return uVar7;
}

Assistant:

uint32_t FACTSoundBank_Prepare(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue
) {
	uint16_t i;
	FACTCue *latest;

	if (pSoundBank == NULL)
	{
		*ppCue = NULL;
		return 1;
	}

	*ppCue = (FACTCue*) pSoundBank->parentEngine->pMalloc(sizeof(FACTCue));
	FAudio_zero(*ppCue, sizeof(FACTCue));

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	/* Engine references */
	(*ppCue)->parentBank = pSoundBank;
	(*ppCue)->next = NULL;
	(*ppCue)->managed = 0;
	(*ppCue)->index = nCueIndex;
	(*ppCue)->notifyOnDestroy = 0;
	(*ppCue)->usercontext = NULL;

	/* Sound data */
	(*ppCue)->data = &pSoundBank->cues[nCueIndex];
	if ((*ppCue)->data->flags & 0x04)
	{
		for (i = 0; i < pSoundBank->soundCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->soundCodes[i])
			{
				(*ppCue)->sound = &pSoundBank->sounds[i];
				break;
			}
		}
	}
	else
	{
		for (i = 0; i < pSoundBank->variationCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->variationCodes[i])
			{
				(*ppCue)->variation = &pSoundBank->variations[i];
				break;
			}
		}
		if ((*ppCue)->variation->flags == 3)
		{
			(*ppCue)->interactive = pSoundBank->parentEngine->variables[
				(*ppCue)->variation->variable
			].initialValue;
		}
	}

	/* Instance data */
	(*ppCue)->variableValues = (float*) pSoundBank->parentEngine->pMalloc(
		sizeof(float) * pSoundBank->parentEngine->variableCount
	);
	for (i = 0; i < pSoundBank->parentEngine->variableCount; i += 1)
	{
		(*ppCue)->variableValues[i] =
			pSoundBank->parentEngine->variables[i].initialValue;
	}

	/* Playback */
	(*ppCue)->state = FACT_STATE_PREPARED;

	/* Add to the SoundBank Cue list */
	if (pSoundBank->cueList == NULL)
	{
		pSoundBank->cueList = *ppCue;
	}
	else
	{
		latest = pSoundBank->cueList;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = *ppCue;
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}